

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::~MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  SharedData *pSVar1;
  CrtAllocator *pCVar2;
  
  pSVar1 = this->shared_;
  if (pSVar1 != (SharedData *)0x0) {
    if (pSVar1->refcount < 2) {
      Clear(this);
      pSVar1 = this->shared_;
      pCVar2 = pSVar1->ownBaseAllocator;
      if (pSVar1->ownBuffer == true) {
        free(pSVar1);
      }
      operator_delete(pCVar2);
      return;
    }
    pSVar1->refcount = pSVar1->refcount - 1;
  }
  return;
}

Assistant:

~MemoryPoolAllocator() RAPIDJSON_NOEXCEPT {
        if (!shared_) {
            // do nothing if moved
            return;
        }
        if (shared_->refcount > 1) {
            --shared_->refcount;
            return;
        }
        Clear();
        BaseAllocator *a = shared_->ownBaseAllocator;
        if (shared_->ownBuffer) {
            baseAllocator_->Free(shared_);
        }
        RAPIDJSON_DELETE(a);
    }